

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  element_type *peVar5;
  __shared_ptr_access<Body,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var6;
  element_type *peVar7;
  shared_ptr<Body> *body_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_> *__range2_2;
  shared_ptr<Body> *body_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_> *__range2_1;
  shared_ptr<Body> *body;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_> *__range2;
  shared_ptr<BHTree> tree;
  undefined1 local_d0 [8];
  shared_ptr<Quad> quad;
  double t;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  value_type local_90 [2];
  undefined8 local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  value_type local_48;
  undefined1 local_38 [8];
  vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_> bodies;
  double radius;
  double dt;
  
  bodies.super__Vector_base<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x424d1a94a2000000;
  std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>::vector
            ((vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_> *)local_38);
  local_50 = 0.0;
  local_58 = 0.0;
  local_60 = 0.0;
  local_68 = 0.0;
  local_70 = 0x4896d52549f0497b;
  std::make_shared<Body,double,double,double,double,double>
            ((double *)&local_48,&local_50,&local_58,&local_60,&local_68);
  std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>::push_back
            ((vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_> *)local_38,
             &local_48);
  std::shared_ptr<Body>::~shared_ptr(&local_48);
  local_98 = 57900000000.0;
  local_a0 = 0.0;
  local_a8 = 0.0;
  local_b0 = 23950000000.0;
  std::make_shared<Body,double,double,double,double,double>
            ((double *)local_90,&local_98,&local_a0,&local_a8,&local_b0);
  std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>::push_back
            ((vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_> *)local_38,
             local_90);
  std::shared_ptr<Body>::~shared_ptr(local_90);
  for (quad.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (double)quad.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi < 0.5;
      quad.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (quad.super___shared_ptr<Quad,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 0.1)) {
    tree.super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0;
    tree.super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
    std::make_shared<Quad,int,int,double&>
              ((int *)local_d0,
               (int *)((long)&tree.super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi + 4),
               (double *)&tree.super___shared_ptr<BHTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::make_shared<BHTree,std::shared_ptr<Quad>&>((shared_ptr<Quad> *)&__range2);
    __end2 = std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>::begin
                       ((vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_> *)
                        local_38);
    body = (shared_ptr<Body> *)
           std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>::end
                     ((vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_> *)
                      local_38);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<Body>_*,_std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>_>
                                       *)&body), bVar4) {
      p_Var6 = (__shared_ptr_access<Body,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<Body>_*,_std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>_>
               ::operator*(&__end2);
      peVar7 = std::__shared_ptr_access<Body,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var6);
      bVar4 = Body::in(peVar7,(shared_ptr<Quad> *)local_d0);
      if (bVar4) {
        peVar5 = std::__shared_ptr_access<BHTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<BHTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                            )&__range2);
        BHTree::insert(peVar5,(shared_ptr<Body> *)p_Var6);
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Body>_*,_std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>::begin
                         ((vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_> *)
                          local_38);
    body_1 = (shared_ptr<Body> *)
             std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>::end
                       ((vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_> *)
                        local_38);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::shared_ptr<Body>_*,_std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>_>
                               *)&body_1), bVar4) {
      p_Var6 = (__shared_ptr_access<Body,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<Body>_*,_std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>_>
               ::operator*(&__end2_1);
      peVar7 = std::__shared_ptr_access<Body,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var6);
      Body::resetForce(peVar7);
      peVar5 = std::__shared_ptr_access<BHTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<BHTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &__range2);
      BHTree::updateForce(peVar5,(shared_ptr<Body> *)p_Var6);
      peVar7 = std::__shared_ptr_access<Body,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var6);
      Body::update(peVar7,0.1);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Body>_*,_std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>_>
      ::operator++(&__end2_1);
    }
    __end2_2 = std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>::begin
                         ((vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_> *)
                          local_38);
    body_2 = (shared_ptr<Body> *)
             std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>::end
                       ((vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_> *)
                        local_38);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<std::shared_ptr<Body>_*,_std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>_>
                               *)&body_2), bVar4) {
      p_Var6 = (__shared_ptr_access<Body,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<Body>_*,_std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>_>
               ::operator*(&__end2_2);
      peVar7 = std::__shared_ptr_access<Body,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var6);
      dVar1 = peVar7->x;
      peVar7 = std::__shared_ptr_access<Body,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var6);
      dVar2 = peVar7->y;
      peVar7 = std::__shared_ptr_access<Body,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var6);
      dVar3 = peVar7->vx;
      peVar7 = std::__shared_ptr_access<Body,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var6);
      printf("%10.3E %10.3E %10.3E %10.3E\n",dVar1,dVar2,dVar3,peVar7->vy);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Body>_*,_std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>_>
      ::operator++(&__end2_2);
    }
    printf("======\n");
    std::shared_ptr<BHTree>::~shared_ptr((shared_ptr<BHTree> *)&__range2);
    std::shared_ptr<Quad>::~shared_ptr((shared_ptr<Quad> *)local_d0);
  }
  std::vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_>::~vector
            ((vector<std::shared_ptr<Body>,_std::allocator<std::shared_ptr<Body>_>_> *)local_38);
  return 0;
}

Assistant:

int main() {
    double dt = 0.1;
    double radius = 2.5E11;

    std::vector<std::shared_ptr<Body>> bodies;
    bodies.push_back(std::make_shared<Body>(0.0, 0.0, 0.0, 0.0, 4.97250E41));
    bodies.push_back(std::make_shared<Body>(5.790E10, 0.0, 0.0, 2.395E10, 8.25500E34));


    for (double t = 0; t < 0.5; t += dt) {
        std::shared_ptr<Quad> quad = std::make_shared<Quad>(0, 0, radius);
        std::shared_ptr<BHTree> tree = std::make_shared<BHTree>(quad);

        for (const auto &body : bodies) {
            if (body->in(quad)) {
                tree->insert(body);
            }
        }

        for (const auto &body : bodies) {
            body->resetForce();
            tree->updateForce(body);
            body->update(dt);
        }

        for (const auto &body : bodies) {
            printf("%10.3E %10.3E %10.3E %10.3E\n", body->x, body->y, body->vx, body->vy);
        }

        printf("======\n");
    }
    return 0;
}